

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O3

Symbol * sym_AddLocalLabel(char *symName)

{
  char *pcVar1;
  char *pcVar2;
  Symbol *pSVar3;
  char *in_RCX;
  char *pcVar4;
  char fullName [256];
  char acStack_118 [256];
  
  pcVar4 = labelScope;
  if ((labelScope != (char *)0x0) && (pcVar1 = strchr(labelScope,0x2e), pcVar1 != (char *)0x0)) {
    __assert_fail("!labelScope || !strchr(labelScope, \'.\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x1e0,"sym_AddLocalLabel");
  }
  pcVar1 = strchr(symName,0x2e);
  if (pcVar1 == (char *)0x0) {
    __assert_fail("localName",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/symbol.cpp"
                  ,0x1e5,"sym_AddLocalLabel");
  }
  if (pcVar1[1] == '\0') {
    pcVar4 = "\'%s\' is a nonsensical reference to an empty local label\n";
  }
  else {
    pcVar2 = strchr(pcVar1 + 1,0x2e);
    if (pcVar2 == (char *)0x0) {
      if (pcVar1 == symName) {
        if (pcVar4 == (char *)0x0) {
          error("Unqualified local label \'%s\' in main scope\n",symName);
          return (Symbol *)0x0;
        }
        fullSymbolName(acStack_118,(size_t)symName,pcVar4,in_RCX);
        symName = acStack_118;
      }
      pSVar3 = addLabel(symName);
      return pSVar3;
    }
    pcVar4 = "\'%s\' is a nonsensical reference to a nested local label\n";
  }
  fatalerror(pcVar4,symName);
}

Assistant:

struct Symbol *sym_AddLocalLabel(char const *symName)
{
	// Assuming no dots in `labelScope` if defined
	assert(!labelScope || !strchr(labelScope, '.'));

	char fullName[MAXSYMLEN + 1];
	char const *localName = strchr(symName, '.');

	assert(localName); // There should be at least one dot in `symName`

	// Check for something after the dot in `localName`
	if (localName[1] == '\0') {
		fatalerror("'%s' is a nonsensical reference to an empty local label\n",
			   symName);
	}
	// Check for more than one dot in `localName`
	if (strchr(localName + 1, '.'))
		fatalerror("'%s' is a nonsensical reference to a nested local label\n",
			   symName);

	if (localName == symName) {
		if (!labelScope) {
			error("Unqualified local label '%s' in main scope\n", symName);
			return NULL;
		}
		// Expand `symName` to the full `labelScope.symName` name
		fullSymbolName(fullName, sizeof(fullName), symName, labelScope);
		symName = fullName;
	}

	return addLabel(symName);
}